

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O0

Fraction * __thiscall Fraction::operator-=(Fraction *this,Fraction *b)

{
  common_type_t<int,_int> cVar1;
  int current_lcm;
  Fraction *b_local;
  Fraction *this_local;
  
  cVar1 = std::lcm<int,int>(this->denominator_,b->denominator_);
  this->numerator_ = (cVar1 / this->denominator_) * this->numerator_;
  this->numerator_ = this->numerator_ - b->numerator_ * (cVar1 / b->denominator_);
  this->denominator_ = cVar1;
  Normalization(this);
  return this;
}

Assistant:

const Fraction& Fraction::operator-=(const Fraction& b) {
  int current_lcm = std::lcm(denominator_, b.denominator_);
  numerator_ *= current_lcm / denominator_;
  numerator_ -= b.numerator_ * (current_lcm / b.denominator_);
  denominator_ = current_lcm;
  Normalization();
  return *this;
}